

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strtou32_base
          (numbers_internal *this,string_view text,uint32_t *value,int base)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  numbers_internal *pnVar4;
  uint uVar5;
  bool local_1d;
  int local_1c;
  string_view local_18;
  
  local_18.length_ = (size_type)text.ptr_;
  local_1c = (int)value;
  *(uint *)text.length_ = 0;
  local_18.ptr_ = (char *)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_18,&local_1c,&local_1d);
  if ((bVar1) && (local_1d == false)) {
    if ((long)local_1c < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                    ,0x319,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType *) [IntType = unsigned int]"
                   );
    }
    pnVar4 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
    uVar3 = 0;
    while( true ) {
      bVar1 = pnVar4 <= local_18.ptr_;
      if ((bVar1) ||
         (uVar5 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_],
         local_1c <= (int)uVar5)) goto LAB_00267649;
      if ((*(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                    (long)local_1c * 4) < uVar3) ||
         (uVar2 = uVar3 * local_1c, uVar3 = uVar2 + uVar5, CARRY4(uVar2,uVar5))) break;
      local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
    }
    uVar3 = 0xffffffff;
LAB_00267649:
    *(uint *)text.length_ = uVar3;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, uint32_t* value, int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}